

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

uint64_t __thiscall clunk::Node::PerftSearch<false>(Node *this,int depth)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  GenerateMoves<false,false>(this,depth);
  uVar3 = (uint64_t)this->moveCount;
  _stats._48_8_ = _stats._48_8_ + uVar3;
  if ((1 < depth) && (this->child != (Node *)0x0)) {
    if (_stop == 0) {
      uVar3 = 0;
      do {
        iVar1 = this->moveIndex;
        if (this->moveCount <= iVar1) {
          return uVar3;
        }
        this->moveIndex = iVar1 + 1;
        Exec<false>(this,this->moves + iVar1,this->child);
        uVar2 = PerftSearch<true>(this->child,depth + -1);
        uVar3 = uVar3 + uVar2;
        Undo<false>(this,this->moves + iVar1);
      } while (_stop == 0);
    }
    else {
      uVar3 = 0;
    }
  }
  return uVar3;
}

Assistant:

uint64_t PerftSearch(const int depth) {
    GenerateMoves<color, false>(depth);
    _stats.snodes += moveCount;
    if (!child || (depth <= 1)) {
      return moveCount;
    }

    uint64_t count = 0;
    while (!_stop && (moveIndex < moveCount)) {
      const Move& move = moves[moveIndex++];
      Exec<color>(move, *child);
      count += child->PerftSearch<!color>(depth - 1);
      Undo<color>(move);
    }
    return count;
  }